

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

MemOp tcg_canonicalize_memop(MemOp op,_Bool is64,_Bool st)

{
  MemOp local_c;
  _Bool st_local;
  _Bool is64_local;
  MemOp op_local;
  
  get_alignment_bits(op);
  local_c = op;
  switch(op & MO_64) {
  case MO_8:
    local_c = op & ~MO_BE;
    break;
  case MO_16:
    break;
  case MO_32:
    if (!is64) {
      local_c = op & ~MO_ASHIFT;
    }
    break;
  case MO_64:
    if (!is64) {
      fprintf(_stderr,"%s:%d: tcg fatal error\n",
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op.c"
              ,0xaf5);
      abort();
    }
  }
  if (st) {
    local_c = local_c & ~MO_ASHIFT;
  }
  return local_c;
}

Assistant:

static inline MemOp tcg_canonicalize_memop(MemOp op, bool is64, bool st)
{
    /* Trigger the asserts within as early as possible.  */
    (void)get_alignment_bits(op);

    switch (op & MO_SIZE) {
    case MO_8:
        op &= ~MO_BSWAP;
        break;
    case MO_16:
        break;
    case MO_32:
        if (!is64) {
            op &= ~MO_SIGN;
        }
        break;
    case MO_64:
        if (!is64) {
            tcg_abort();
        }
        break;
    }
    if (st) {
        op &= ~MO_SIGN;
    }
    return op;
}